

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::anon_unknown_0::DepthBiasBaseCase::initialize(DepthBiasBaseCase *this)

{
  undefined1 *this_00;
  VkFormat VVar1;
  DeviceInterface *pDVar2;
  RefData<vk::Handle<(vk::HandleType)16>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)14>_> data_01;
  RefData<vk::Handle<(vk::HandleType)13>_> data_02;
  RefData<vk::Handle<(vk::HandleType)13>_> data_03;
  RefData<vk::Handle<(vk::HandleType)17>_> data_04;
  RefData<vk::Handle<(vk::HandleType)18>_> data_05;
  RefData<vk::Handle<(vk::HandleType)23>_> data_06;
  RefData<vk::Handle<(vk::HandleType)24>_> data_07;
  RefData<vk::VkCommandBuffer_s_*> data_08;
  VkAttachmentDescription attachment;
  VkAttachmentDescription attachment_00;
  VkSubpassDescription subpass;
  VkExtent3D _extent;
  VkExtent3D _extent_00;
  undefined8 uVar3;
  deUint32 _queueFamilyIndex;
  InstanceInterface *pIVar4;
  VkPhysicalDevice pVVar5;
  NotSupportedError *this_01;
  ProgramCollection<vk::ProgramBinary> *pPVar6;
  ProgramBinary *pPVar7;
  Allocator *pAVar8;
  Image *pIVar9;
  Handle<(vk::HandleType)16> *pHVar10;
  Handle<(vk::HandleType)17> *pHVar11;
  Handle<(vk::HandleType)14> *pHVar12;
  Handle<(vk::HandleType)13> *pHVar13;
  reference pvVar14;
  size_type sVar15;
  Buffer *pBVar16;
  void *dst;
  reference src;
  VkDeviceSize offset;
  Handle<(vk::HandleType)24> *pHVar17;
  Move<vk::VkCommandBuffer_s_*> local_ff0;
  RefData<vk::VkCommandBuffer_s_*> local_fd0;
  Move<vk::Handle<(vk::HandleType)24>_> local_fb0;
  RefData<vk::Handle<(vk::HandleType)24>_> local_f90;
  undefined1 local_f70 [8];
  CmdPoolCreateInfo cmdPoolCreateInfo;
  Allocation local_f38;
  VkDeviceMemory local_f18;
  Allocation local_f10;
  void *local_ef0;
  deUint8 *ptr;
  BufferCreateInfo local_ee0;
  undefined1 local_e90 [24];
  VkDeviceSize dataSize;
  RefData<vk::Handle<(vk::HandleType)23>_> local_e58;
  deUint64 local_e38;
  undefined1 local_e30 [8];
  FramebufferCreateInfo framebufferCreateInfo;
  undefined1 local_de8 [8];
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachments;
  Move<vk::Handle<(vk::HandleType)18>_> local_dc8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_da8;
  allocator<vk::VkDynamicState> local_d81;
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> local_d80;
  DynamicState local_d68;
  allocator<unsigned_int> local_d2d;
  value_type_conflict2 local_d2c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d28;
  MultiSampleState local_d10;
  VkPipelineRasterizationStateCreateInfo local_cc8;
  allocator<vk::VkRect2D> local_c81;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_c80;
  allocator<vk::VkViewport> local_c61;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_c60;
  ViewportState local_c48;
  ColorBlendState local_be8;
  VkPipelineInputAssemblyStateCreateInfo local_b98;
  VkPipelineVertexInputStateCreateInfo local_b78;
  deUint64 local_b40;
  VkPipelineShaderStageCreateInfo local_b38;
  deUint64 local_b08;
  VkPipelineShaderStageCreateInfo local_b00;
  deUint64 local_ad0;
  VkPipelineLayout local_ac8;
  undefined1 local_ac0 [8];
  PipelineCreateInfo pipelineCreateInfo;
  Attachment vkCbAttachmentState;
  void *pvStack_7b0;
  undefined8 local_7a8;
  VkVertexInputBindingDescription *pVStack_7a0;
  undefined8 local_798;
  VkVertexInputAttributeDescription *pVStack_790;
  undefined1 auStack_788 [8];
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  undefined1 local_760 [8];
  VkVertexInputBindingDescription vertexInputBindingDescription;
  RefData<vk::Handle<(vk::HandleType)17>_> local_730;
  undefined8 local_710;
  SubpassDescription local_708;
  VkSubpassDescription local_658;
  undefined8 local_610;
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  undefined4 uStack_5f8;
  undefined8 uStack_5f4;
  undefined8 local_5ec;
  undefined8 uStack_5e4;
  VkImageLayout local_5dc;
  VkAttachmentDescription local_5ac;
  VkAttachmentDescription local_588;
  undefined1 local_558 [8];
  RenderPassCreateInfo renderPassCreateInfo;
  RefData<vk::Handle<(vk::HandleType)13>_> local_468;
  VkComponentMapping local_448;
  VkImage local_438;
  undefined1 local_430 [8];
  ImageViewCreateInfo attachmentViewInfo;
  RefData<vk::Handle<(vk::HandleType)13>_> local_3c0;
  VkComponentMapping local_3a0;
  VkImage local_390;
  undefined1 local_388 [8];
  ImageViewCreateInfo colorTargetViewInfo;
  undefined1 local_330 [48];
  undefined1 local_300 [8];
  ImageCreateInfo depthStencilImageCreateInfo;
  undefined1 local_288 [48];
  undefined1 local_258 [8];
  ImageCreateInfo targetImageCreateInfo;
  VkExtent3D imageExtent;
  RefData<vk::Handle<(vk::HandleType)14>_> local_1b8;
  undefined1 local_198 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fs;
  RefData<vk::Handle<(vk::HandleType)14>_> local_158;
  undefined1 local_138 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vs;
  RefData<vk::Handle<(vk::HandleType)16>_> local_f8;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_> local_d8;
  undefined1 local_c0 [8];
  PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
  allocator<char> local_49;
  string local_48;
  undefined1 local_24 [4];
  uint local_20;
  VkFormatProperties formatProperties;
  VkDevice device;
  DepthBiasBaseCase *this_local;
  
  formatProperties._4_8_ = Context::getDevice((this->super_TestInstance).m_context);
  pIVar4 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar5 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  (*pIVar4->_vptr_InstanceInterface[3])(pIVar4,pVVar5,0x81,local_24);
  if ((local_20 & 0x200) == 0) {
    pIVar4 = Context::getInstanceInterface((this->super_TestInstance).m_context);
    pVVar5 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
    (*pIVar4->_vptr_InstanceInterface[3])(pIVar4,pVVar5,0x82,local_24);
    if ((local_20 & 0x200) == 0) {
      pipelineLayoutCreateInfo.m_pushConstantRanges.
      super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"No valid depth stencil attachment available",&local_49);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_48);
      pipelineLayoutCreateInfo.m_pushConstantRanges.
      super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    this->m_depthStencilAttachmentFormat = VK_FORMAT_D32_SFLOAT_S8_UINT;
  }
  else {
    this->m_depthStencilAttachmentFormat = VK_FORMAT_D24_UNORM_S8_UINT;
  }
  local_d8.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  vector(&local_d8);
  Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            ((PipelineLayoutCreateInfo *)local_c0,&local_d8,0,(VkPushConstantRange *)0x0);
  std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  ~vector(&local_d8);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator,
             this->m_vk,(VkDevice)formatProperties._4_8_,(VkPipelineLayoutCreateInfo *)local_c0,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_f8,
             (Move *)&vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator);
  data.deleter.m_deviceIface._0_4_ = (int)local_f8.deleter.m_deviceIface;
  data.object.m_internal = local_f8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_f8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_f8.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_f8.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_f8.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=(&this->m_pipelineLayout,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator);
  uVar3 = formatProperties._4_8_;
  pDVar2 = this->m_vk;
  pPVar6 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  pPVar7 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar6,&this->m_vertexShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &fs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator,pDVar2,
             (VkDevice)uVar3,pPVar7,0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_158,
             (Move *)&fs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_158.deleter.m_deviceIface;
  data_00.object.m_internal = local_158.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_158.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_158.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_158.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_158.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_158.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_138,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &fs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator);
  uVar3 = formatProperties._4_8_;
  pDVar2 = this->m_vk;
  pPVar6 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  pPVar7 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar6,&this->m_fragmentShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&imageExtent.depth,pDVar2,(VkDevice)uVar3,
             pPVar7,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b8,(Move *)&imageExtent.depth);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_1b8.deleter.m_deviceIface;
  data_01.object.m_internal = local_1b8.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1b8.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_1b8.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_1b8.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_1b8.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_1b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_198,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&imageExtent.depth);
  targetImageCreateInfo.m_queueFamilyIndices.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x8000000080;
  imageExtent.width = 1;
  local_288._40_4_ = 1;
  local_288._32_8_ = (VkDevice)0x8000000080;
  local_288._24_4_ = 1;
  local_288._16_8_ = 0x8000000080;
  _extent_00.depth = 1;
  _extent_00.width = 0x80;
  _extent_00.height = 0x80;
  Draw::ImageCreateInfo::ImageCreateInfo
            ((ImageCreateInfo *)local_258,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent_00,
             1,1,VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x13,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  uVar3 = formatProperties._4_8_;
  pDVar2 = this->m_vk;
  pAVar8 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  depthStencilImageCreateInfo.m_queueFamilyIndices.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = ::vk::MemoryRequirement::Any.m_flags;
  Draw::Image::createAndAlloc
            ((Image *)local_288,pDVar2,(VkDevice)uVar3,(VkImageCreateInfo *)local_258,pAVar8,
             ::vk::MemoryRequirement::Any);
  de::SharedPtr<vkt::Draw::Image>::operator=
            (&this->m_colorTargetImage,(SharedPtr<vkt::Draw::Image> *)local_288);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr((SharedPtr<vkt::Draw::Image> *)local_288);
  local_330._40_4_ = imageExtent.width;
  local_330._32_8_ =
       targetImageCreateInfo.m_queueFamilyIndices.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_330._24_4_ = imageExtent.width;
  local_330._16_8_ =
       targetImageCreateInfo.m_queueFamilyIndices.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  _extent.depth = imageExtent.width;
  _extent._0_8_ =
       targetImageCreateInfo.m_queueFamilyIndices.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  Draw::ImageCreateInfo::ImageCreateInfo
            ((ImageCreateInfo *)local_300,VK_IMAGE_TYPE_2D,this->m_depthStencilAttachmentFormat,
             _extent,1,1,VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x22,
             VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  uVar3 = formatProperties._4_8_;
  pDVar2 = this->m_vk;
  pAVar8 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  colorTargetViewInfo.super_VkImageViewCreateInfo._76_4_ = ::vk::MemoryRequirement::Any.m_flags;
  Draw::Image::createAndAlloc
            ((Image *)local_330,pDVar2,(VkDevice)uVar3,(VkImageCreateInfo *)local_300,pAVar8,
             ::vk::MemoryRequirement::Any);
  de::SharedPtr<vkt::Draw::Image>::operator=
            (&this->m_depthStencilImage,(SharedPtr<vkt::Draw::Image> *)local_330);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr((SharedPtr<vkt::Draw::Image> *)local_330);
  pIVar9 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_colorTargetImage);
  local_390 = Draw::Image::object(pIVar9);
  VVar1 = this->m_colorAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&local_3a0,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            ((ImageViewCreateInfo *)local_388,local_390,VK_IMAGE_VIEW_TYPE_2D,VVar1,&local_3a0,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)
             &attachmentViewInfo.super_VkImageViewCreateInfo.subresourceRange.layerCount,this->m_vk,
             (VkDevice)formatProperties._4_8_,(VkImageViewCreateInfo *)local_388,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_3c0,
             (Move *)&attachmentViewInfo.super_VkImageViewCreateInfo.subresourceRange.layerCount);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_3c0.deleter.m_deviceIface;
  data_02.object.m_internal = local_3c0.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3c0.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_3c0.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_3c0.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_3c0.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_3c0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
            (&this->m_colorTargetView,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)
             &attachmentViewInfo.super_VkImageViewCreateInfo.subresourceRange.layerCount);
  pIVar9 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_depthStencilImage);
  local_438 = Draw::Image::object(pIVar9);
  VVar1 = this->m_depthStencilAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&local_448,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            ((ImageViewCreateInfo *)local_430,local_438,VK_IMAGE_VIEW_TYPE_2D,VVar1,&local_448,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)
             &renderPassCreateInfo.m_dependiencesStructs.
              super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,this->m_vk,
             (VkDevice)formatProperties._4_8_,(VkImageViewCreateInfo *)local_430,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_468,
             (Move *)&renderPassCreateInfo.m_dependiencesStructs.
                      super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_468.deleter.m_deviceIface;
  data_03.object.m_internal = local_468.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_468.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_468.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_468.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_468.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_468.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
            (&this->m_attachmentView,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)
             &renderPassCreateInfo.m_dependiencesStructs.
              super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  Draw::RenderPassCreateInfo::RenderPassCreateInfo
            ((RenderPassCreateInfo *)local_558,0,(VkAttachmentDescription *)0x0,0,
             (VkSubpassDescription *)0x0,0,(VkSubpassDependency *)0x0);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&local_5ac,this->m_colorAttachmentFormat,VK_SAMPLE_COUNT_1_BIT
             ,VK_ATTACHMENT_LOAD_OP_LOAD,VK_ATTACHMENT_STORE_OP_STORE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_STORE,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_GENERAL);
  local_588.finalLayout = local_5ac.finalLayout;
  local_588.storeOp = local_5ac.storeOp;
  local_588.stencilLoadOp = local_5ac.stencilLoadOp;
  local_588.stencilStoreOp = local_5ac.stencilStoreOp;
  local_588.initialLayout = local_5ac.initialLayout;
  local_588.flags = local_5ac.flags;
  local_588.format = local_5ac.format;
  local_588.samples = local_5ac.samples;
  local_588.loadOp = local_5ac.loadOp;
  attachment.samples = local_5ac.samples;
  attachment.flags = local_5ac.flags;
  attachment.format = local_5ac.format;
  attachment.loadOp = local_5ac.loadOp;
  attachment.storeOp = local_5ac.storeOp;
  attachment.stencilLoadOp = local_5ac.stencilLoadOp;
  attachment.stencilStoreOp = local_5ac.stencilStoreOp;
  attachment.initialLayout = local_5ac.initialLayout;
  attachment.finalLayout = local_5ac.finalLayout;
  Draw::RenderPassCreateInfo::addAttachment((RenderPassCreateInfo *)local_558,attachment);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&colorAttachmentReference.layout,
             this->m_depthStencilAttachmentFormat,VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_LOAD,
             VK_ATTACHMENT_STORE_OP_STORE,VK_ATTACHMENT_LOAD_OP_DONT_CARE,
             VK_ATTACHMENT_STORE_OP_STORE,VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
  attachment_00.samples = (int)uStack_5f4;
  attachment_00.flags = colorAttachmentReference.layout;
  attachment_00.format = uStack_5f8;
  attachment_00.loadOp = (int)((ulong)uStack_5f4 >> 0x20);
  attachment_00.storeOp = (int)local_5ec;
  attachment_00.stencilLoadOp = (int)((ulong)local_5ec >> 0x20);
  attachment_00.stencilStoreOp = (int)uStack_5e4;
  attachment_00.initialLayout = (int)((ulong)uStack_5e4 >> 0x20);
  attachment_00.finalLayout = local_5dc;
  Draw::RenderPassCreateInfo::addAttachment((RenderPassCreateInfo *)local_558,attachment_00);
  depthAttachmentReference.attachment = 0;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_GENERAL;
  local_610 = 0x300000001;
  local_710 = 0x300000001;
  Draw::SubpassDescription::SubpassDescription
            (&local_708,VK_PIPELINE_BIND_POINT_GRAPHICS,0,0,(VkAttachmentReference *)0x0,1,
             &depthAttachmentReference,(VkAttachmentReference *)0x0,
             (VkAttachmentReference)0x300000001,0,(deUint32 *)0x0);
  local_658.pPreserveAttachments = local_708.super_VkSubpassDescription.pPreserveAttachments;
  local_658.pDepthStencilAttachment = local_708.super_VkSubpassDescription.pDepthStencilAttachment;
  local_658.preserveAttachmentCount = local_708.super_VkSubpassDescription.preserveAttachmentCount;
  local_658._60_4_ = local_708.super_VkSubpassDescription._60_4_;
  local_658.pColorAttachments = local_708.super_VkSubpassDescription.pColorAttachments;
  local_658.pResolveAttachments = local_708.super_VkSubpassDescription.pResolveAttachments;
  local_658.pInputAttachments = local_708.super_VkSubpassDescription.pInputAttachments;
  local_658.colorAttachmentCount = local_708.super_VkSubpassDescription.colorAttachmentCount;
  local_658._28_4_ = local_708.super_VkSubpassDescription._28_4_;
  local_658.flags = local_708.super_VkSubpassDescription.flags;
  local_658.pipelineBindPoint = local_708.super_VkSubpassDescription.pipelineBindPoint;
  local_658.inputAttachmentCount = local_708.super_VkSubpassDescription.inputAttachmentCount;
  local_658._12_4_ = local_708.super_VkSubpassDescription._12_4_;
  subpass.inputAttachmentCount = local_708.super_VkSubpassDescription.inputAttachmentCount;
  subpass.flags = local_708.super_VkSubpassDescription.flags;
  subpass.pipelineBindPoint = local_708.super_VkSubpassDescription.pipelineBindPoint;
  subpass._12_4_ = local_708.super_VkSubpassDescription._12_4_;
  subpass.pInputAttachments._0_4_ = (int)local_708.super_VkSubpassDescription.pInputAttachments;
  subpass.pInputAttachments._4_4_ =
       (int)((ulong)local_708.super_VkSubpassDescription.pInputAttachments >> 0x20);
  subpass.colorAttachmentCount = local_708.super_VkSubpassDescription.colorAttachmentCount;
  subpass._28_4_ = local_708.super_VkSubpassDescription._28_4_;
  subpass.pColorAttachments._0_4_ = (int)local_708.super_VkSubpassDescription.pColorAttachments;
  subpass.pColorAttachments._4_4_ =
       (int)((ulong)local_708.super_VkSubpassDescription.pColorAttachments >> 0x20);
  subpass.pResolveAttachments._0_4_ = (int)local_708.super_VkSubpassDescription.pResolveAttachments;
  subpass.pResolveAttachments._4_4_ =
       (int)((ulong)local_708.super_VkSubpassDescription.pResolveAttachments >> 0x20);
  subpass.pDepthStencilAttachment = local_708.super_VkSubpassDescription.pDepthStencilAttachment;
  subpass.preserveAttachmentCount = local_708.super_VkSubpassDescription.preserveAttachmentCount;
  subpass._60_4_ = local_708.super_VkSubpassDescription._60_4_;
  subpass.pPreserveAttachments._0_4_ =
       (int)local_708.super_VkSubpassDescription.pPreserveAttachments;
  subpass.pPreserveAttachments._4_4_ =
       (int)((ulong)local_708.super_VkSubpassDescription.pPreserveAttachments >> 0x20);
  Draw::RenderPassCreateInfo::addSubpass((RenderPassCreateInfo *)local_558,subpass);
  Draw::SubpassDescription::~SubpassDescription(&local_708);
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&vertexInputBindingDescription.inputRate,
             this->m_vk,(VkDevice)formatProperties._4_8_,(VkRenderPassCreateInfo *)local_558,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_730,(Move *)&vertexInputBindingDescription.inputRate);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_730.deleter.m_deviceIface;
  data_04.object.m_internal = local_730.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_730.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_730.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_730.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_730.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_730.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::operator=(&this->m_renderPass,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&vertexInputBindingDescription.inputRate);
  local_760._0_4_ = 0;
  local_760._4_4_ = 0x20;
  vertexInputBindingDescription.binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R4G4_UNORM_PACK8;
  vertexInputAttributeDescriptions[0].offset = 0;
  vertexInputAttributeDescriptions[1].location = 0x6d;
  vertexInputAttributeDescriptions[1].binding = 0x10;
  auStack_788._0_4_ = 0;
  auStack_788._4_4_ = 0;
  vertexInputAttributeDescriptions[0].location = 0x6d;
  vertexInputAttributeDescriptions[0].binding = 0;
  Draw::PipelineCreateInfo::VertexInputState::VertexInputState
            ((VertexInputState *)
             &vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp,1,
             (VkVertexInputBindingDescription *)local_760,2,
             (VkVertexInputAttributeDescription *)auStack_788);
  *(undefined8 *)
   &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
    vertexAttributeDescriptionCount = local_798;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexAttributeDescriptions
       = pVStack_790;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags =
       (undefined4)local_7a8;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
  vertexBindingDescriptionCount = local_7a8._4_4_;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pVertexBindingDescriptions =
       pVStack_7a0;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.sType =
       vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp;
  *(VkColorComponentFlags *)
   &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.field_0x4 =
       vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState.colorWriteMask;
  (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext = pvStack_7b0;
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            ((Attachment *)
             &pipelineCreateInfo.m_multisampleStateSampleMask.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,VK_BLEND_FACTOR_SRC_COLOR,
             VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,VK_BLEND_FACTOR_SRC_COLOR,
             VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  local_ac8.m_internal = pHVar10->m_internal;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_ad0 = pHVar11->m_internal;
  Draw::PipelineCreateInfo::PipelineCreateInfo
            ((PipelineCreateInfo *)local_ac0,local_ac8,(VkRenderPass)local_ad0,0,0);
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_138);
  local_b08 = pHVar12->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_b00,(VkShaderModule)local_b08,"main",
             VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_ac0,&local_b00);
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_198);
  local_b40 = pHVar12->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_b38,(VkShaderModule)local_b40,"main",
             VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_ac0,&local_b38);
  local_b78.sType = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.sType;
  local_b78._4_4_ =
       *(undefined4 *)
        &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.field_0x4;
  local_b78.pNext = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext;
  local_b78.flags = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags;
  local_b78.vertexBindingDescriptionCount =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       vertexBindingDescriptionCount;
  local_b78.pVertexBindingDescriptions =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       pVertexBindingDescriptions;
  local_b78.vertexAttributeDescriptionCount =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       vertexAttributeDescriptionCount;
  local_b78._36_4_ =
       *(undefined4 *)
        &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.field_0x24;
  local_b78.pVertexAttributeDescriptions =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       pVertexAttributeDescriptions;
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_ac0,&local_b78);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&local_b98,this->m_topology,0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_ac0,&local_b98);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            (&local_be8,1,
             (VkPipelineColorBlendAttachmentState *)
             &pipelineCreateInfo.m_multisampleStateSampleMask.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_ac0,&local_be8.super_VkPipelineColorBlendStateCreateInfo);
  Draw::PipelineCreateInfo::ColorBlendState::~ColorBlendState(&local_be8);
  std::allocator<vk::VkViewport>::allocator(&local_c61);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector(&local_c60,0,&local_c61);
  std::allocator<vk::VkRect2D>::allocator(&local_c81);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector(&local_c80,0,&local_c81);
  Draw::PipelineCreateInfo::ViewportState::ViewportState(&local_c48,1,&local_c60,&local_c80);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_ac0,&local_c48.super_VkPipelineViewportStateCreateInfo);
  Draw::PipelineCreateInfo::ViewportState::~ViewportState(&local_c48);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~vector(&local_c80);
  std::allocator<vk::VkRect2D>::~allocator(&local_c81);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~vector(&local_c60);
  std::allocator<vk::VkViewport>::~allocator(&local_c61);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_ac0,
             &(this->m_depthStencilState).super_VkPipelineDepthStencilStateCreateInfo);
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&local_cc8,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_ac0,&local_cc8);
  local_d2c = 0xffffffff;
  std::allocator<unsigned_int>::allocator(&local_d2d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_d28,1,&local_d2c,&local_d2d);
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            (&local_d10,VK_SAMPLE_COUNT_1_BIT,0,0.0,&local_d28,false,false);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_ac0,&local_d10.super_VkPipelineMultisampleStateCreateInfo);
  Draw::PipelineCreateInfo::MultiSampleState::~MultiSampleState(&local_d10);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_d28);
  std::allocator<unsigned_int>::~allocator(&local_d2d);
  std::allocator<vk::VkDynamicState>::allocator(&local_d81);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::vector
            (&local_d80,0,&local_d81);
  Draw::PipelineCreateInfo::DynamicState::DynamicState(&local_d68,&local_d80);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_ac0,&local_d68.super_VkPipelineDynamicStateCreateInfo);
  Draw::PipelineCreateInfo::DynamicState::~DynamicState(&local_d68);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~vector(&local_d80);
  std::allocator<vk::VkDynamicState>::~allocator(&local_d81);
  uVar3 = formatProperties._4_8_;
  pDVar2 = this->m_vk;
  ::vk::Handle<(vk::HandleType)15>::Handle
            ((Handle<(vk::HandleType)15> *)
             &attachments.
              super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  ::vk::createGraphicsPipeline
            (&local_dc8,pDVar2,(VkDevice)uVar3,
             (VkPipelineCache)
             attachments.
             super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (VkGraphicsPipelineCreateInfo *)local_ac0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_da8,(Move *)&local_dc8);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_da8.deleter.m_deviceIface;
  data_05.object.m_internal = local_da8.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_da8.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_da8.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_da8.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_da8.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_da8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=(&this->m_pipeline,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_dc8);
  this_00 = &framebufferCreateInfo.super_VkFramebufferCreateInfo.field_0x3f;
  std::allocator<vk::Handle<(vk::HandleType)13>_>::allocator
            ((allocator<vk::Handle<(vk::HandleType)13>_> *)this_00);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_> *
         )local_de8,2,(allocator_type *)this_00);
  std::allocator<vk::Handle<(vk::HandleType)13>_>::~allocator
            ((allocator<vk::Handle<(vk::HandleType)13>_> *)
             &framebufferCreateInfo.super_VkFramebufferCreateInfo.field_0x3f);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      (&(this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  pvVar14 = std::
            vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            ::operator[]((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          *)local_de8,0);
  pvVar14->m_internal = pHVar13->m_internal;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      (&(this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  pvVar14 = std::
            vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            ::operator[]((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                          *)local_de8,1);
  pvVar14->m_internal = pHVar13->m_internal;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_e38 = pHVar11->m_internal;
  Draw::FramebufferCreateInfo::FramebufferCreateInfo
            ((FramebufferCreateInfo *)local_e30,(VkRenderPass)local_e38,
             (vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
              *)local_de8,0x80,0x80,1);
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&dataSize,this->m_vk,
             (VkDevice)formatProperties._4_8_,(VkFramebufferCreateInfo *)local_e30,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e58,(Move *)&dataSize);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_e58.deleter.m_deviceIface;
  data_06.object.m_internal = local_e58.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_e58.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_e58.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_e58.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_e58.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_e58.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=(&this->m_framebuffer,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&dataSize);
  sVar15 = std::
           vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
           ::size(&this->m_data);
  uVar3 = formatProperties._4_8_;
  local_e90._16_8_ = sVar15 << 5;
  pDVar2 = this->m_vk;
  Draw::BufferCreateInfo::BufferCreateInfo
            (&local_ee0,local_e90._16_8_,0x80,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  pAVar8 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  ptr._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  Draw::Buffer::createAndAlloc
            ((Buffer *)local_e90,pDVar2,(VkDevice)uVar3,&local_ee0.super_VkBufferCreateInfo,pAVar8,
             ::vk::MemoryRequirement::HostVisible);
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            (&this->m_vertexBuffer,(SharedPtr<vkt::Draw::Buffer> *)local_e90);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr((SharedPtr<vkt::Draw::Buffer> *)local_e90);
  Draw::BufferCreateInfo::~BufferCreateInfo(&local_ee0);
  pBVar16 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_vertexBuffer);
  Draw::Buffer::getBoundMemory(&local_f10,pBVar16);
  dst = ::vk::Allocation::getHostPtr(&local_f10);
  ::vk::Allocation::~Allocation(&local_f10);
  local_ef0 = dst;
  src = std::
        vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
        ::operator[](&this->m_data,0);
  ::deMemcpy(dst,src,local_e90._16_8_);
  uVar3 = formatProperties._4_8_;
  pDVar2 = this->m_vk;
  pBVar16 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_vertexBuffer);
  Draw::Buffer::getBoundMemory(&local_f38,pBVar16);
  local_f18 = ::vk::Allocation::getMemory(&local_f38);
  pBVar16 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_vertexBuffer);
  Draw::Buffer::getBoundMemory
            ((Allocation *)&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo.flags,pBVar16);
  offset = ::vk::Allocation::getOffset
                     ((Allocation *)&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo.flags);
  ::vk::flushMappedMemoryRange(pDVar2,(VkDevice)uVar3,local_f18,offset,local_e90._16_8_);
  ::vk::Allocation::~Allocation
            ((Allocation *)&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo.flags);
  ::vk::Allocation::~Allocation(&local_f38);
  _queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo((CmdPoolCreateInfo *)local_f70,_queueFamilyIndex,2);
  ::vk::createCommandPool
            (&local_fb0,this->m_vk,(VkDevice)formatProperties._4_8_,
             (VkCommandPoolCreateInfo *)local_f70,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_f90,(Move *)&local_fb0);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_f90.deleter.m_deviceIface;
  data_07.object.m_internal = local_f90.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_f90.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device._0_4_ = (int)local_f90.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_f90.deleter.m_device >> 0x20);
  data_07.deleter.m_allocator._0_4_ = (int)local_f90.deleter.m_allocator;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_f90.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::operator=(&this->m_cmdPool,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_fb0);
  uVar3 = formatProperties._4_8_;
  pDVar2 = this->m_vk;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  ::vk::allocateCommandBuffer
            (&local_ff0,pDVar2,(VkDevice)uVar3,(VkCommandPool)pHVar17->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_fd0,(Move *)&local_ff0);
  data_08.deleter.m_deviceIface._0_4_ = (int)local_fd0.deleter.m_deviceIface;
  data_08.object = local_fd0.object;
  data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_fd0.deleter.m_deviceIface >> 0x20);
  data_08.deleter.m_device._0_4_ = (int)local_fd0.deleter.m_device;
  data_08.deleter.m_device._4_4_ = (int)((ulong)local_fd0.deleter.m_device >> 0x20);
  data_08.deleter.m_pool.m_internal._0_4_ = (int)local_fd0.deleter.m_pool.m_internal;
  data_08.deleter.m_pool.m_internal._4_4_ = (int)(local_fd0.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::operator=(&this->m_cmdBuffer,data_08);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_ff0);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           *)local_de8);
  Draw::PipelineCreateInfo::~PipelineCreateInfo((PipelineCreateInfo *)local_ac0);
  Draw::RenderPassCreateInfo::~RenderPassCreateInfo((RenderPassCreateInfo *)local_558);
  Draw::ImageCreateInfo::~ImageCreateInfo((ImageCreateInfo *)local_300);
  Draw::ImageCreateInfo::~ImageCreateInfo((ImageCreateInfo *)local_258);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_198);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_138);
  Draw::PipelineLayoutCreateInfo::~PipelineLayoutCreateInfo((PipelineLayoutCreateInfo *)local_c0);
  return;
}

Assistant:

void initialize (void)
	{
		const vk::VkDevice device	= m_context.getDevice();

		vk::VkFormatProperties formatProperties;
		// check for VK_FORMAT_D24_UNORM_S8_UINT support
		m_context.getInstanceInterface().getPhysicalDeviceFormatProperties(m_context.getPhysicalDevice(), vk::VK_FORMAT_D24_UNORM_S8_UINT, &formatProperties);
		if (formatProperties.optimalTilingFeatures & vk::VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT)
		{
			m_depthStencilAttachmentFormat = vk::VK_FORMAT_D24_UNORM_S8_UINT;
		}
		else
		{
			// check for VK_FORMAT_D32_SFLOAT_S8_UINT support
			m_context.getInstanceInterface().getPhysicalDeviceFormatProperties(m_context.getPhysicalDevice(), vk::VK_FORMAT_D32_SFLOAT_S8_UINT, &formatProperties);
			if (formatProperties.optimalTilingFeatures & vk::VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT)
			{
				m_depthStencilAttachmentFormat = vk::VK_FORMAT_D32_SFLOAT_S8_UINT;
			}
			else
				throw tcu::NotSupportedError("No valid depth stencil attachment available");
		}

		const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
		m_pipelineLayout			= vk::createPipelineLayout(m_vk, device, &pipelineLayoutCreateInfo);

		const vk::Unique<vk::VkShaderModule> vs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_vertexShaderName), 0));
		const vk::Unique<vk::VkShaderModule> fs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_fragmentShaderName), 0));

		const vk::VkExtent3D imageExtent = { WIDTH, HEIGHT, 1 };
		ImageCreateInfo targetImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_colorAttachmentFormat, imageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT, vk::VK_IMAGE_TILING_OPTIMAL,
											  vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT | vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT);

		m_colorTargetImage = Image::createAndAlloc(m_vk, device, targetImageCreateInfo, m_context.getDefaultAllocator());

		const ImageCreateInfo depthStencilImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_depthStencilAttachmentFormat, imageExtent,
														  1, 1, vk::VK_SAMPLE_COUNT_1_BIT, vk::VK_IMAGE_TILING_OPTIMAL,
														  vk::VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT);

		m_depthStencilImage = Image::createAndAlloc(m_vk, device, depthStencilImageCreateInfo, m_context.getDefaultAllocator());

		const ImageViewCreateInfo colorTargetViewInfo(m_colorTargetImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_colorAttachmentFormat);
		m_colorTargetView = vk::createImageView(m_vk, device, &colorTargetViewInfo);

		const ImageViewCreateInfo attachmentViewInfo(m_depthStencilImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_depthStencilAttachmentFormat);
		m_attachmentView = vk::createImageView(m_vk, device, &attachmentViewInfo);

		RenderPassCreateInfo renderPassCreateInfo;
		renderPassCreateInfo.addAttachment(AttachmentDescription(m_colorAttachmentFormat,
																 vk::VK_SAMPLE_COUNT_1_BIT,
																 vk::VK_ATTACHMENT_LOAD_OP_LOAD,
																 vk::VK_ATTACHMENT_STORE_OP_STORE,
																 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,
																 vk::VK_ATTACHMENT_STORE_OP_STORE,
																 vk::VK_IMAGE_LAYOUT_GENERAL,
																 vk::VK_IMAGE_LAYOUT_GENERAL));

		renderPassCreateInfo.addAttachment(AttachmentDescription(m_depthStencilAttachmentFormat,
																 vk::VK_SAMPLE_COUNT_1_BIT,
																 vk::VK_ATTACHMENT_LOAD_OP_LOAD,
																 vk::VK_ATTACHMENT_STORE_OP_STORE,
																 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,
																 vk::VK_ATTACHMENT_STORE_OP_STORE,
																 vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
																 vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL));

		const vk::VkAttachmentReference colorAttachmentReference =
		{
			0,
			vk::VK_IMAGE_LAYOUT_GENERAL
		};

		const vk::VkAttachmentReference depthAttachmentReference =
		{
			1,
			vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL
		};

		renderPassCreateInfo.addSubpass(SubpassDescription(vk::VK_PIPELINE_BIND_POINT_GRAPHICS,
														   0,
														   0,
														   DE_NULL,
														   1,
														   &colorAttachmentReference,
														   DE_NULL,
														   depthAttachmentReference,
														   0,
														   DE_NULL));

		m_renderPass = vk::createRenderPass(m_vk, device, &renderPassCreateInfo);

		const vk::VkVertexInputBindingDescription vertexInputBindingDescription =
		{
			0,
			(deUint32)sizeof(tcu::Vec4) * 2,
			vk::VK_VERTEX_INPUT_RATE_VERTEX,
		};

		const vk::VkVertexInputAttributeDescription vertexInputAttributeDescriptions[2] =
		{
			{
				0u,
				0u,
				vk::VK_FORMAT_R32G32B32A32_SFLOAT,
				0u
			},
			{
				1u,
				0u,
				vk::VK_FORMAT_R32G32B32A32_SFLOAT,
				(deUint32)(sizeof(float)* 4),
			}
		};

		m_vertexInputState = PipelineCreateInfo::VertexInputState(1,
																  &vertexInputBindingDescription,
																  2,
																  vertexInputAttributeDescriptions);

		const PipelineCreateInfo::ColorBlendState::Attachment vkCbAttachmentState;

		PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, 0);
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", vk::VK_SHADER_STAGE_VERTEX_BIT));
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", vk::VK_SHADER_STAGE_FRAGMENT_BIT));
		pipelineCreateInfo.addState(PipelineCreateInfo::VertexInputState(m_vertexInputState));
		pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(m_topology));
		pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &vkCbAttachmentState));
		pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1));
		pipelineCreateInfo.addState(m_depthStencilState);
		pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
		pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
		pipelineCreateInfo.addState(PipelineCreateInfo::DynamicState());

		m_pipeline = vk::createGraphicsPipeline(m_vk, device, DE_NULL, &pipelineCreateInfo);

		std::vector<vk::VkImageView> attachments(2);
		attachments[0] = *m_colorTargetView;
		attachments[1] = *m_attachmentView;

		const FramebufferCreateInfo framebufferCreateInfo(*m_renderPass, attachments, WIDTH, HEIGHT, 1);

		m_framebuffer = vk::createFramebuffer(m_vk, device, &framebufferCreateInfo);

		const vk::VkDeviceSize dataSize = m_data.size() * sizeof(PositionColorVertex);
		m_vertexBuffer = Buffer::createAndAlloc(m_vk, device, BufferCreateInfo(dataSize,
			vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT),
			m_context.getDefaultAllocator(), vk::MemoryRequirement::HostVisible);

		deUint8* ptr = reinterpret_cast<unsigned char *>(m_vertexBuffer->getBoundMemory().getHostPtr());
		deMemcpy(ptr, &m_data[0], static_cast<size_t>(dataSize));

		vk::flushMappedMemoryRange(m_vk, device,
								   m_vertexBuffer->getBoundMemory().getMemory(),
								   m_vertexBuffer->getBoundMemory().getOffset(),
								   dataSize);

		const CmdPoolCreateInfo cmdPoolCreateInfo(m_context.getUniversalQueueFamilyIndex());
		m_cmdPool = vk::createCommandPool(m_vk, device, &cmdPoolCreateInfo);
		m_cmdBuffer = vk::allocateCommandBuffer(m_vk, device, *m_cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY);
	}